

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O2

void __thiscall Memory::LargeHeapBlock::WBSetBitRange(LargeHeapBlock *this,char *addr,uint count)

{
  int iVar1;
  BVIndex i;
  bool bVar2;
  AutoCriticalSection local_30;
  AutoCriticalSection autoCs;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  iVar1 = *(int *)&(this->super_HeapBlock).address;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&autoCs.cs + 4),ExceptionType_DisableCheck);
  local_30.cs = &wbVerifyBitsLock;
  CCLock::Enter(&wbVerifyBitsLock.super_CCLock);
  i = (uint)((int)addr - iVar1) >> 3;
  while (bVar2 = count != 0, count = count - 1, bVar2) {
    BVSparse<Memory::HeapAllocator>::Set(&this->wbVerifyBits,i);
    i = i + 1;
  }
  AutoCriticalSection::~AutoCriticalSection(&local_30);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&autoCs.cs + 4));
  return;
}

Assistant:

void LargeHeapBlock::WBSetBitRange(char* addr, uint count)
{
    uint index = (uint)(addr - this->address) / sizeof(void*);
    try
    {
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(static_cast<ExceptionType>(ExceptionType_DisableCheck));
        AutoCriticalSection autoCs(&wbVerifyBitsLock);
        for (uint i = 0; i < count; i++)
        {
            wbVerifyBits.Set(index + i);
        }
    }
    catch (Js::OutOfMemoryException&)
    {
    }
}